

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_log_contexts.cpp
# Opt level: O0

void __thiscall
duckdb::DuckDBLogContextData::DuckDBLogContextData
          (DuckDBLogContextData *this,shared_ptr<duckdb::LogStorage,_true> *log_storage_p)

{
  LogStorage *pLVar1;
  type pLVar2;
  GlobalTableFunctionState *in_RDI;
  shared_ptr<duckdb::LogStorage,_true> *in_stack_ffffffffffffff98;
  shared_ptr<duckdb::LogStorage,_true> *in_stack_ffffffffffffffa0;
  shared_ptr<duckdb::LogStorage,_true> *this_00;
  shared_ptr<duckdb::LogStorage,_true> local_28 [2];
  
  GlobalTableFunctionState::GlobalTableFunctionState(in_RDI);
  in_RDI->_vptr_GlobalTableFunctionState = (_func_int **)&PTR__DuckDBLogContextData_0351d6a0;
  shared_ptr<duckdb::LogStorage,_true>::shared_ptr
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>::
  unique_ptr((unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
              *)0x145fead);
  pLVar1 = shared_ptr<duckdb::LogStorage,_true>::operator->(in_stack_ffffffffffffffa0);
  (*pLVar1->_vptr_LogStorage[9])(local_28);
  this_00 = local_28;
  unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>::
  operator=((unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
             *)this_00,
            (unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
             *)in_stack_ffffffffffffff98);
  unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
               *)0x145fef9);
  pLVar1 = shared_ptr<duckdb::LogStorage,_true>::operator->(this_00);
  pLVar2 = unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
           ::operator*((unique_ptr<duckdb::LogStorageScanState,_std::default_delete<duckdb::LogStorageScanState>,_true>
                        *)this_00);
  (*pLVar1->_vptr_LogStorage[0xb])(pLVar1,pLVar2);
  return;
}

Assistant:

explicit DuckDBLogContextData(shared_ptr<LogStorage> log_storage_p) : log_storage(std::move(log_storage_p)) {
		scan_state = log_storage->CreateScanContextsState();
		log_storage->InitializeScanContexts(*scan_state);
	}